

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

void __thiscall YAJLTables::fetch_qtable(YAJLTables *this,bitio_stream *bstream)

{
  ulong uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  int iVar3;
  bool bVar4;
  YAJLQTable table;
  YAJLQTable local_30;
  
  sVar2 = bitio::bitio_stream::read(bstream,0x10,in_RDX,in_RCX);
  iVar3 = (int)sVar2 + -2;
  if (iVar3 != 0) {
    do {
      YAJLQTable::YAJLQTable(&local_30,bstream);
      bVar4 = local_30.precision == '\0';
      uVar1 = (ulong)local_30.dest_id;
      this->qtables[uVar1].precision = local_30.precision;
      this->qtables[uVar1].dest_id = local_30.dest_id;
      this->qtables[uVar1].coeffs = local_30.coeffs;
      iVar3 = (uint)bVar4 * 0x40 + iVar3 + -0x81;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void YAJLTables::fetch_qtable(bitio::bitio_stream *bstream) {
    u32 seg_len = bstream->read(0x10);
    // exclude size of Lq which is 2 bytes
    seg_len -= 2;
    while (seg_len > 0) {
        YAJLQTable table(bstream);
        u8 qk_size = table.precision == 0 ? 8 : 16;
        qtables[table.dest_id] = table;
        seg_len -= 1 + (qk_size << 3);
    }
}